

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

void __thiscall
fmt::v11::buffered_file::buffered_file(buffered_file *this,cstring_view filename,cstring_view mode)

{
  uint uVar1;
  char *__filename;
  char *__modes;
  FILE *pFVar2;
  int *piVar3;
  undefined8 uVar4;
  uint *puVar5;
  bool bVar6;
  format_string<const_char_*> fmt;
  buffered_file *this_local;
  cstring_view mode_local;
  cstring_view filename_local;
  
  this_local = (buffered_file *)mode.data_;
  mode_local.data_ = filename.data_;
  do {
    __filename = basic_cstring_view<char>::c_str(&mode_local);
    __modes = basic_cstring_view<char>::c_str((basic_cstring_view<char> *)&this_local);
    pFVar2 = fopen(__filename,__modes);
    this->file_ = (FILE *)pFVar2;
    bVar6 = false;
    if (this->file_ == (FILE *)0x0) {
      piVar3 = __errno_location();
      bVar6 = *piVar3 == 4;
    }
  } while (bVar6);
  if (this->file_ == (FILE *)0x0) {
    uVar4 = __cxa_allocate_exception(0x20);
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    basic_cstring_view<char>::c_str(&mode_local);
    fmt.str_.data_ = (char *)(ulong)uVar1;
    fmt.str_.size_ = (size_t)"cannot open file {}";
    system_error<char_const*>((int)uVar4,fmt,(char **)0x13);
    __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

buffered_file::buffered_file(cstring_view filename, cstring_view mode) {
  FMT_RETRY_VAL(file_, FMT_SYSTEM(fopen(filename.c_str(), mode.c_str())),
                nullptr);
  if (!file_)
    FMT_THROW(system_error(errno, FMT_STRING("cannot open file {}"),
                           filename.c_str()));
}